

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duration.cc
# Opt level: O3

Duration * __thiscall absl::lts_20250127::Duration::operator%=(Duration *this,Duration rhs)

{
  int iVar1;
  uint uVar2;
  uint32_t uVar3;
  ulong uVar4;
  HiRep HVar5;
  HiRep HVar6;
  
  uVar3 = rhs.rep_lo_;
  HVar6 = rhs.rep_hi_;
  HVar5 = this->rep_hi_;
  uVar2 = this->rep_lo_;
  if (uVar3 == 0xffffffff || uVar2 == 0xffffffff) {
LAB_002a4fee:
    anon_unknown_1::IDivSlowPath(false,*this,rhs,this);
    return this;
  }
  if (HVar6 == (HiRep)0x0) {
    if ((int)uVar3 < 4000) {
      if (uVar3 == 4) {
        if (0x225c17c < (ulong)HVar5 >> 8) goto LAB_002a4fee;
        uVar2 = uVar2 & 3;
        goto LAB_002a4fe4;
      }
      if ((uVar3 != 400) || (0xd6bf94d454 < (ulong)HVar5)) goto LAB_002a4fee;
      iVar1 = (uVar2 / 400) * 400;
    }
    else if (uVar3 == 4000) {
      if (0x8637bd04b55 < (ulong)HVar5) goto LAB_002a4fee;
      iVar1 = (uVar2 / 4000) * 4000;
    }
    else {
      if ((uVar3 != 4000000) || (0x20c49ba5a64af6 < (ulong)HVar5)) goto LAB_002a4fee;
      iVar1 = (uVar2 / 4000000) * 4000000;
    }
    uVar2 = uVar2 - iVar1;
  }
  else {
    if (uVar3 != 0 || (long)HVar6 < 1) goto LAB_002a4fee;
    if ((long)HVar5 < 0) {
      uVar4 = -((ulong)(uVar2 != 0) + (long)HVar5) % (ulong)HVar6;
      HVar5 = (HiRep)~uVar4;
      if (uVar2 == 0) {
        HVar5 = (HiRep)-uVar4;
      }
      goto LAB_002a4fe6;
    }
    if (HVar6 != (HiRep)0x1) {
      HVar5 = (HiRep)((ulong)HVar5 % (ulong)HVar6);
      goto LAB_002a4fe6;
    }
  }
LAB_002a4fe4:
  HVar5.lo_ = 0;
  HVar5.hi_ = 0;
LAB_002a4fe6:
  this->rep_hi_ = HVar5;
  this->rep_lo_ = uVar2;
  return this;
}

Assistant:

Duration& Duration::operator%=(Duration rhs) {
  IDivDurationImpl(false, *this, rhs, this);
  return *this;
}